

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evtsrc.c
# Opt level: O0

_Bool al_emit_user_event(ALLEGRO_EVENT_SOURCE *src,ALLEGRO_EVENT *event,
                        _func_void_ALLEGRO_USER_EVENT_ptr *dtor)

{
  void *ptr;
  ALLEGRO_EVENT *in_RDX;
  ALLEGRO_EVENT_SOURCE *in_RSI;
  char *in_RDI;
  double dVar1;
  ALLEGRO_EVENT_SOURCE_REAL *rsrc;
  ALLEGRO_USER_EVENT_DESCRIPTOR *descr;
  _Bool rc;
  size_t num_queues;
  char *in_stack_ffffffffffffffc8;
  ALLEGRO_EVENT_SOURCE *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint line;
  
  if (in_RDX == (ALLEGRO_EVENT *)0x0) {
    in_RSI->__pad[6] = 0;
    in_RSI->__pad[7] = 0;
  }
  else {
    in_stack_ffffffffffffffd0 =
         (ALLEGRO_EVENT_SOURCE *)
         al_malloc_with_context
                   (CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),in_stack_ffffffffffffffc8,
                    (char *)0x175048);
    in_stack_ffffffffffffffd0->__pad[2] = 0;
    *(ALLEGRO_EVENT **)in_stack_ffffffffffffffd0->__pad = in_RDX;
    *(ALLEGRO_EVENT_SOURCE **)(in_RSI->__pad + 6) = in_stack_ffffffffffffffd0;
  }
  _al_event_source_lock(in_stack_ffffffffffffffd0);
  ptr = (void *)_al_vector_size((_AL_VECTOR *)(in_RDI + 0x30));
  if (ptr == (void *)0x0) {
    line = in_stack_ffffffffffffffdc & 0xffffff;
  }
  else {
    dVar1 = al_get_time();
    *(double *)(in_RSI->__pad + 4) = dVar1;
    _al_event_source_emit_event(in_RSI,in_RDX);
    line = CONCAT13(1,(int3)in_stack_ffffffffffffffdc);
  }
  _al_event_source_unlock(in_stack_ffffffffffffffd0);
  if ((in_RDX != (ALLEGRO_EVENT *)0x0) && ((line & 0x1000000) == 0)) {
    (*(code *)in_RDX)(in_RSI);
    al_free_with_context(ptr,line,(char *)in_stack_ffffffffffffffd0,in_RDI);
  }
  return (_Bool)((byte)(line >> 0x18) & 1);
}

Assistant:

bool al_emit_user_event(ALLEGRO_EVENT_SOURCE *src,
   ALLEGRO_EVENT *event, void (*dtor)(ALLEGRO_USER_EVENT *))
{
   size_t num_queues;
   bool rc;

   ASSERT(src);
   ASSERT(event);

   if (dtor) {
      ALLEGRO_USER_EVENT_DESCRIPTOR *descr = al_malloc(sizeof(*descr));
      descr->refcount = 0;
      descr->dtor = dtor;
      event->user.__internal__descr = descr;
   }
   else {
      event->user.__internal__descr = NULL;
   }

   _al_event_source_lock(src);
   {
      ALLEGRO_EVENT_SOURCE_REAL *rsrc = (ALLEGRO_EVENT_SOURCE_REAL *)src;

      num_queues = _al_vector_size(&rsrc->queues);
      if (num_queues > 0) {
         event->any.timestamp = al_get_time();
         _al_event_source_emit_event(src, event);
         rc = true;
      }
      else {
         rc = false;
      }
   }
   _al_event_source_unlock(src);

   if (dtor && !rc) {
      dtor(&event->user);
      al_free(event->user.__internal__descr);
   }

   return rc;
}